

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O0

void __thiscall cmm::InfixOpExprAST::dump(InfixOpExprAST *this,string *prefix)

{
  string *psVar1;
  ostream *poVar2;
  pointer pEVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *prefix_local;
  InfixOpExprAST *this_local;
  
  local_18 = prefix;
  prefix_local = (string *)this;
  psVar1 = getSymbol_abi_cxx11_(this);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)psVar1);
  std::operator<<(poVar2,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_18);
  std::operator<<(poVar2,"|---");
  pEVar3 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::operator->
                     (&this->LHS);
  std::operator+(&local_38,local_18,"|   ");
  (*(pEVar3->super_AST)._vptr_AST[2])(pEVar3,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)local_18);
  std::operator<<(poVar2,"`---");
  pEVar3 = std::unique_ptr<cmm::ExpressionAST,_std::default_delete<cmm::ExpressionAST>_>::operator->
                     (&this->RHS);
  std::operator+(&local_68,local_18,"    ");
  (*(pEVar3->super_AST)._vptr_AST[2])(pEVar3,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

void InfixOpExprAST::dump(const std::string &prefix) const {
  std::cout << getSymbol() << "\n";

  std::cout << prefix << "|---";
  LHS->dump(prefix + "|   ");

  std::cout << prefix << "`---";
  RHS->dump(prefix + "    ");
}